

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::source_location_formatter<spdlog::details::scoped_padder>::format
          (source_location_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_3,
          memory_buf_t *dest)

{
  string_view_t view;
  bool bVar1;
  long in_RSI;
  memory_buf_t *in_RDI;
  scoped_padder p;
  size_t text_size;
  char *in_stack_ffffffffffffff78;
  scoped_padder *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  scoped_padder *in_stack_ffffffffffffffa0;
  memory_buf_t *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  
  bVar1 = source_loc::empty((source_loc *)(in_RSI + 0x38));
  if (!bVar1) {
    bVar1 = padding_info::enabled((padding_info *)&(in_RDI->super_buffer<char>).ptr_);
    if (bVar1) {
      in_stack_ffffffffffffff80 =
           (scoped_padder *)std::char_traits<char>::length((char_type *)0x233bc6);
      scoped_padder::count_digits<int>(0);
    }
    scoped_padder::scoped_padder
              (in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98,
               (padding_info *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_RDI)
    ;
    ::fmt::v7::basic_string_view<char>::basic_string_view
              ((basic_string_view<char> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    view.size_ = (size_t)in_stack_ffffffffffffffa0;
    view.data_ = in_stack_ffffffffffffff98;
    fmt_helper::append_string_view
              (view,(memory_buf_t *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    ::fmt::v7::detail::buffer<char>::push_back
              ((buffer<char> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    fmt_helper::append_int<int>(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
    scoped_padder::~scoped_padder(in_stack_ffffffffffffff80);
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        if (msg.source.empty())
        {
            return;
        }

        size_t text_size;
        if (padinfo_.enabled())
        {
            // calc text size for padding based on "filename:line"
            text_size = std::char_traits<char>::length(msg.source.filename) + ScopedPadder::count_digits(msg.source.line) + 1;
        }
        else
        {
            text_size = 0;
        }

        ScopedPadder p(text_size, padinfo_, dest);
        fmt_helper::append_string_view(msg.source.filename, dest);
        dest.push_back(':');
        fmt_helper::append_int(msg.source.line, dest);
    }